

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForBuildTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  string installPrefix;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&local_48);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    bVar2 = MacOSXUseInstallNameDir(this);
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"CMAKE_INSTALL_PREFIX",&local_69);
      psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_48);
      std::__cxx11::string::string((string *)&local_68,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_48);
      GetInstallNameDirForInstallTree(__return_storage_ptr__,this,config,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      return __return_storage_ptr__;
    }
    bVar2 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_BUILD);
    if (bVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      bVar2 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar2) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
      else {
        GetDirectory(&local_68,this,config,RuntimeBinaryArtifact);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForBuildTree(
  const std::string& config) const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {

    // If building directly for installation then the build tree install_name
    // is the same as the install tree.
    if (this->MacOSXUseInstallNameDir()) {
      std::string installPrefix =
        this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
      return this->GetInstallNameDirForInstallTree(config, installPrefix);
    }

    // Use the build tree directory for the target.
    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_BUILD)) {
      std::string dir;
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath";
      } else {
        dir = this->GetDirectory(config);
      }
      dir += "/";
      return dir;
    }
  }
  return "";
}